

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O1

void __thiscall
Js::TypedArrayBase::SetObjectNoDetachCheck
          (TypedArrayBase *this,RecyclableObject *source,uint32 targetLength,uint32 offset)

{
  undefined8 uVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  undefined4 *puVar6;
  uint uVar7;
  ulong uVar8;
  undefined8 local_40;
  Var itemValue;
  
  itemValue = (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).scriptContext.ptr;
  uVar4 = GetSourceLength(this,source,targetLength,offset);
  if (((this->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x3a1,"(!this->IsDetachedBuffer())","!this->IsDetachedBuffer()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (uVar4 != 0) {
    uVar1 = *(undefined8 *)(*(long *)((long)itemValue + 8) + 0x430);
    uVar8 = 0;
    do {
      iVar5 = (*(source->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x26])(source,source,uVar8,&local_40,itemValue);
      if (iVar5 != 1) {
        local_40 = uVar1;
      }
      (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.super_RecyclableObject
        .super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                (this,(ulong)(offset + (int)uVar8),local_40);
      uVar7 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar7;
    } while (uVar4 != uVar7);
  }
  if (((this->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached == false) {
    return;
  }
  Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

void TypedArrayBase::SetObjectNoDetachCheck(RecyclableObject* source, uint32 targetLength, uint32 offset)
    {
        ScriptContext* scriptContext = GetScriptContext();
        uint32 sourceLength = GetSourceLength(source, targetLength, offset);
        Assert(!this->IsDetachedBuffer());

        Var itemValue;
        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();
        for (uint32 i = 0; i < sourceLength; i++)
        {
            if (!source->GetItem(source, i, &itemValue, scriptContext))
            {
                itemValue = undefinedValue;
            }
            DirectSetItemNoDetachCheck(offset + i, itemValue);
        }

        if (this->IsDetachedBuffer())
        {
            // We cannot be detached when we are creating the typed array itself. Terminate if that happens.
            Throw::FatalInternalError();
        }
    }